

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall BooleanInstance::BooleanInstance(BooleanInstance *this,string *value)

{
  bool bVar1;
  undefined8 *puVar2;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Boolean",&local_31);
  Instance::Instance(&this->super_Instance,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__CharacterInstance_0017be20;
  bVar1 = Grammar::is_boolean_value(value);
  if (bVar1) {
    bVar1 = std::operator==(value,"true");
    this->_value = bVar1;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

BooleanInstance::BooleanInstance(const std::string& value) : Instance("Boolean") {
    if (!Grammar::is_boolean_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = (value == "true");
}